

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O1

ngx_chain_t * ngx_chain_update_sent(ngx_chain_t *in,off_t sent)

{
  ushort uVar1;
  ngx_buf_t *pnVar2;
  long lVar3;
  long lVar4;
  
  if (in != (ngx_chain_t *)0x0) {
    do {
      pnVar2 = in->buf;
      uVar1 = *(ushort *)&pnVar2->field_0x48;
      if ((uVar1 & 0xe0) == 0 || (uVar1 & 0x17) != 0) {
        if (sent == 0) {
          return in;
        }
        if ((uVar1 & 7) == 0) {
          lVar4 = pnVar2->file_last - pnVar2->file_pos;
        }
        else {
          lVar4 = (long)pnVar2->last - (long)pnVar2->pos;
        }
        lVar3 = sent - lVar4;
        if (sent < lVar4) {
          if ((uVar1 & 7) != 0) {
            pnVar2->pos = pnVar2->pos + sent;
          }
          if ((pnVar2->field_0x48 & 0x10) == 0) {
            return in;
          }
          pnVar2->file_pos = pnVar2->file_pos + sent;
          return in;
        }
        if ((uVar1 & 7) != 0) {
          pnVar2->pos = pnVar2->last;
        }
        sent = lVar3;
        if ((pnVar2->field_0x48 & 0x10) != 0) {
          pnVar2->file_pos = pnVar2->file_last;
        }
      }
      in = in->next;
    } while (in != (ngx_chain_t *)0x0);
  }
  return in;
}

Assistant:

ngx_chain_t *
ngx_chain_update_sent(ngx_chain_t *in, off_t sent)
{
    off_t  size;

    for ( /* void */ ; in; in = in->next) {

        if (ngx_buf_special(in->buf)) {
            continue;
        }

        if (sent == 0) {
            break;
        }

        size = ngx_buf_size(in->buf);

        if (sent >= size) {
            sent -= size;

            if (ngx_buf_in_memory(in->buf)) {
                in->buf->pos = in->buf->last;
            }

            if (in->buf->in_file) {
                in->buf->file_pos = in->buf->file_last;
            }

            continue;
        }

        if (ngx_buf_in_memory(in->buf)) {
            in->buf->pos += (size_t) sent;
        }

        if (in->buf->in_file) {
            in->buf->file_pos += sent;
        }

        break;
    }

    return in;
}